

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_24::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  bool bVar1;
  int size;
  Descriptor *pDVar2;
  FileDescriptor *this;
  DescriptorPool *pDVar3;
  Message *pMVar4;
  uint8_t *buffer;
  MessageLite *this_00;
  type options_00;
  LogMessage *pLVar5;
  string_view sVar6;
  LogMessage local_120;
  Voidify local_10d;
  undefined4 local_10c;
  undefined1 local_108 [8];
  CodedInputStream input;
  string serialized;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_88;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  dynamic_options;
  DynamicMessageFactory factory;
  Descriptor *option_descriptor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *option_entries_local;
  DescriptorPool *pool_local;
  Message *options_local;
  int depth_local;
  
  pDVar2 = Message::GetDescriptor(options);
  this = Descriptor::file(pDVar2);
  pDVar3 = FileDescriptor::pool(this);
  if (pDVar3 == pool) {
    options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  }
  else {
    pDVar2 = Message::GetDescriptor(options);
    sVar6 = Descriptor::full_name(pDVar2);
    pDVar2 = DescriptorPool::FindMessageTypeByName(pool,sVar6);
    if (pDVar2 == (Descriptor *)0x0) {
      options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
    }
    else {
      DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&dynamic_options);
      pMVar4 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&dynamic_options,pDVar2)
      ;
      pMVar4 = Message::New(pMVar4);
      std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
      unique_ptr<std::default_delete<google::protobuf::Message>,void>
                ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                  *)&local_88,pMVar4);
      MessageLite::SerializeAsString_abi_cxx11_
                ((string *)&input.extension_factory_,&options->super_MessageLite);
      buffer = (uint8_t *)std::__cxx11::string::data();
      size = std::__cxx11::string::size();
      io::CodedInputStream::CodedInputStream((CodedInputStream *)local_108,buffer,size);
      io::CodedInputStream::SetExtensionRegistry
                ((CodedInputStream *)local_108,pool,(MessageFactory *)&dynamic_options);
      this_00 = &std::
                 unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 ::operator->(&local_88)->super_MessageLite;
      bVar1 = MessageLite::ParseFromCodedStream(this_00,(CodedInputStream *)local_108);
      if (bVar1) {
        options_00 = std::
                     unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                     ::operator*(&local_88);
        options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,options_00,option_entries);
      }
      else {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_120,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0xdbc);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_120);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [38])"Found invalid proto option data for: ");
        pDVar2 = Message::GetDescriptor(options);
        sVar6 = Descriptor::full_name(pDVar2);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,sVar6);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_10d,pLVar5);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_120);
        options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
      }
      local_10c = 1;
      io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_108);
      std::__cxx11::string::~string((string *)&input.extension_factory_);
      std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
      ~unique_ptr(&local_88);
      DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&dynamic_options);
    }
  }
  return options_local._7_1_;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<std::string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == nullptr) {
      // descriptor.proto is not in the pool. This means no custom options are
      // used so we are safe to proceed with the compiled options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    std::string serialized = options.SerializeAsString();
    io::CodedInputStream input(
        reinterpret_cast<const uint8_t*>(serialized.data()), serialized.size());
    input.SetExtensionRegistry(pool, &factory);
    if (dynamic_options->ParseFromCodedStream(&input)) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      ABSL_LOG(ERROR) << "Found invalid proto option data for: "
                      << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}